

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cxx
# Opt level: O0

string * __thiscall kwssys::Directory::GetFilePath_abi_cxx11_(Directory *this,size_t i)

{
  ulong uVar1;
  char *pcVar2;
  string *psVar3;
  size_type in_RDX;
  long *in_RSI;
  string *in_RDI;
  string *abs;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(*in_RSI + 0x18));
  uVar1 = std::__cxx11::string::empty();
  if (((uVar1 & 1) == 0) && (pcVar2 = (char *)std::__cxx11::string::back(), *pcVar2 != '/')) {
    std::__cxx11::string::operator+=((string *)in_RDI,'/');
  }
  psVar3 = (string *)
           std::
           vector<kwssys::DirectoryInternals::FileData,_std::allocator<kwssys::DirectoryInternals::FileData>_>
           ::operator[]((vector<kwssys::DirectoryInternals::FileData,_std::allocator<kwssys::DirectoryInternals::FileData>_>
                         *)*in_RSI,in_RDX);
  std::__cxx11::string::operator+=((string *)in_RDI,psVar3);
  return in_RDI;
}

Assistant:

std::string Directory::GetFilePath(std::size_t i) const
{
  std::string abs = this->Internal->Path;
  if (!abs.empty() && abs.back() != '/') {
    abs += '/';
  }
  abs += this->Internal->Files[i].Name;
  return abs;
}